

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> __thiscall
pbrt::Integrator::Create
          (Integrator *this,string *name,ParameterDictionary *parameters,CameraHandle *camera,
          SamplerHandle *sampler,PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights_00;
  int iVar1;
  char *fmt;
  undefined8 in_stack_fffffffffffffde0;
  polymorphic_allocator<pbrt::ParsedParameter_*> in_stack_fffffffffffffde8;
  undefined1 local_208 [16];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1f8;
  undefined1 local_1e0 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1c8;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_1b0;
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [16];
  SamplerHandle local_190;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_188;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_170;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_158;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_140;
  undefined1 local_128 [24];
  undefined1 local_110 [24];
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_f8;
  undefined1 local_f0 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_d8;
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_48;
  
  this->_vptr_Integrator = (_func_int **)0x0;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    local_140.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(camera->
                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  ).bits;
    local_140.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(sampler->
                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
    local_140.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(aggregate->
                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                  ).bits;
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_60,lights);
    PathIntegrator::Create
              ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
               (SamplerHandle *)
               &local_140.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (PrimitiveHandle *)
               &local_140.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish,&local_140,(FileLoc *)local_60);
    this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
    local_90._0_8_ = local_60._0_8_;
    local_90._16_8_ = local_60._16_8_;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      local_158.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(camera->
                    super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                    ).bits;
      local_158.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(sampler->
                    super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                    ).bits;
      local_158.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(aggregate->
                    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                    ).bits;
      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_78,lights);
      SimplePathIntegrator::Create
                ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                 (SamplerHandle *)
                 &local_158.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (PrimitiveHandle *)
                 &local_158.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish,&local_158,(FileLoc *)local_78);
      this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
      local_90._0_8_ = local_78._0_8_;
      local_90._16_8_ = local_78._16_8_;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        local_170.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
        local_170.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(sampler->
                      super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits;
        local_170.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(aggregate->
                      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                      ).bits;
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_90,lights)
        ;
        LightPathIntegrator::Create
                  ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                   (SamplerHandle *)
                   &local_170.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (PrimitiveHandle *)
                   &local_170.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish,&local_170,(FileLoc *)local_90);
        this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          local_188.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(camera->
                        super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                        ).bits;
          local_188.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)(sampler->
                        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                        ).bits;
          local_188.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)(aggregate->
                        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                        ).bits;
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_a8,
                     lights);
          SimpleVolPathIntegrator::Create
                    ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                     (SamplerHandle *)
                     &local_188.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (PrimitiveHandle *)
                     &local_188.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data._M_finish,&local_188,(FileLoc *)local_a8);
          this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
          local_90._0_8_ = local_a8._0_8_;
          local_90._16_8_ = local_a8._16_8_;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            local_190.
            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(camera->
                      super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                      ).bits;
            local_1a0._8_8_ =
                 (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            local_1a0._0_8_ =
                 (aggregate->
                 super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                 ).bits;
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_c0,
                       lights);
            VolPathIntegrator::Create
                      ((ParameterDictionary *)&stack0xfffffffffffffde8,(CameraHandle *)parameters,
                       &local_190,(PrimitiveHandle *)(local_1a0 + 8),
                       (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_1a0,
                       (FileLoc *)local_c0);
            this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
            local_90._0_8_ = local_c0._0_8_;
            local_90._16_8_ = local_c0._16_8_;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 == 0) {
              local_1a8._M_p =
                   (pointer)(camera->
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            ).bits;
              local_1b0.bits =
                   (sampler->
                   super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
              local_1c8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(aggregate->
                            super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                            ).bits;
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        (&local_d8,lights);
              BDPTIntegrator::Create
                        ((BDPTIntegrator *)&stack0xfffffffffffffde8,parameters,
                         (CameraHandle *)&local_1a8,(SamplerHandle *)&local_1b0,
                         (PrimitiveHandle *)
                         &local_1c8.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d8,loc);
              this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
              local_90._0_8_ =
                   local_d8.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_start;
              local_90._16_8_ =
                   local_d8.
                   super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 == 0) {
                local_1c8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     (pointer)(camera->
                              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                              ).bits;
                local_1c8.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(aggregate->
                              super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                              ).bits;
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_f0
                           ,lights);
                MLTIntegrator::Create
                          ((ParameterDictionary *)&stack0xfffffffffffffde8,
                           (CameraHandle *)parameters,
                           (PrimitiveHandle *)
                           &local_1c8.
                            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_1c8,
                           (FileLoc *)local_f0);
                this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                local_90._0_8_ = local_f0._0_8_;
                local_90._16_8_ = local_f0._16_8_;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 == 0) {
                  local_f8.bits = (ulong)&colorSpace->illuminant | 0x2000000000000;
                  local_1e0._16_8_ =
                       (camera->
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       ).bits;
                  local_1e0._8_8_ =
                       (sampler->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
                  local_1e0._0_8_ =
                       (aggregate->
                       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                       ).bits;
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            (&local_48,lights);
                  lights_00.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffde0;
                  lights_00.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)&local_48;
                  lights_00.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)in_stack_fffffffffffffde8.memoryResource;
                  AOIntegrator::Create
                            ((ParameterDictionary *)&stack0xfffffffffffffde8,
                             (SpectrumHandle *)parameters,(CameraHandle *)&local_f8,
                             (SamplerHandle *)(local_1e0 + 0x10),(PrimitiveHandle *)(local_1e0 + 8),
                             lights_00,(FileLoc *)local_1e0);
                  this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                  local_90._0_8_ =
                       local_48.
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_90._16_8_ =
                       local_48.
                       super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)name);
                  if (iVar1 == 0) {
                    local_1f8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(camera->
                                  super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                  ).bits;
                    local_1f8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(sampler->
                                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                                  ).bits;
                    local_1f8.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start =
                         (pointer)(aggregate->
                                  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                  ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               local_110,lights);
                    RandomWalkIntegrator::Create
                              ((ParameterDictionary *)&stack0xfffffffffffffde8,
                               (CameraHandle *)parameters,
                               (SamplerHandle *)
                               &local_1f8.
                                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (PrimitiveHandle *)
                               &local_1f8.
                                super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_1f8,
                               (FileLoc *)local_110);
                    this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                    local_90._0_8_ = local_110._0_8_;
                    local_90._16_8_ = local_110._16_8_;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)name);
                    if (iVar1 != 0) {
                      fmt = "%s: integrator type unknown.";
                      goto LAB_0040cdd3;
                    }
                    local_208._8_8_ =
                         (camera->
                         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                         ).bits;
                    local_208._0_8_ =
                         (aggregate->
                         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                         ).bits;
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               local_128,lights);
                    SPPMIntegrator::Create
                              ((ParameterDictionary *)&stack0xfffffffffffffde8,
                               (RGBColorSpace *)parameters,(CameraHandle *)colorSpace,
                               (PrimitiveHandle *)(local_208 + 8),
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               local_208,(FileLoc *)local_128);
                    this->_vptr_Integrator = (_func_int **)in_stack_fffffffffffffde8.memoryResource;
                    local_90._0_8_ = local_128._0_8_;
                    local_90._16_8_ = local_128._16_8_;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((pointer)local_90._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ - local_90._0_8_);
  }
  if (this->_vptr_Integrator != (_func_int **)0x0) {
    ParameterDictionary::ReportUnused(parameters);
    return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
           this;
  }
  fmt = "%s: unable to create integrator.";
LAB_0040cdd3:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, aggregate,
                                            lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}